

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

void __thiscall
Assimp::D3MF::D3MFExporter::writeRelInfoToFile(D3MFExporter *this,string *folder,string *relName)

{
  pointer pcVar1;
  long *plVar2;
  runtime_error *this_00;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string entry;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  if (this->m_zipArchive != (zip_t *)0x0) {
    pcVar1 = (folder->_M_dataplus)._M_p;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + folder->_M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)(relName->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_38 = *plVar3;
      lStack_30 = plVar2[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar3;
      local_48 = (long *)*plVar2;
    }
    local_40 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    zip_entry_open(this->m_zipArchive,(char *)local_48);
    std::__cxx11::stringbuf::str();
    zip_entry_write(this->m_zipArchive,local_68,local_60);
    zip_entry_close(this->m_zipArchive);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"3MF-Export: Zip archive not valid, nullptr.","");
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void D3MFExporter::writeRelInfoToFile( const std::string &folder, const std::string &relName ) {
    if ( nullptr == m_zipArchive ) {
        throw DeadlyExportError( "3MF-Export: Zip archive not valid, nullptr." );
    }
    const std::string entry = folder + "/" + relName;
    zip_entry_open( m_zipArchive, entry.c_str() );

    const std::string &exportTxt( mRelOutput.str() );
    zip_entry_write( m_zipArchive, exportTxt.c_str(), exportTxt.size() );

    zip_entry_close( m_zipArchive );
}